

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O2

void __thiscall
upb_test::FuzzTest_NegativeOneofIndex_Test::TestBody(FuzzTest_NegativeOneofIndex_Test *this)

{
  string_view text_proto;
  ParseTextProtoOrDie local_70;
  FileDescriptorSet local_50;
  
  text_proto._M_str =
       "file {\n             message_type {\n               name: \"A\"\n               field { name: \"A\" number: 0 type_name: \"\" oneof_index: -1 }\n             }\n           }\n      "
  ;
  text_proto._M_len = 0xa9;
  ParseTextProtoOrDie::ParseTextProtoOrDie(&local_70,text_proto);
  ParseTextProtoOrDie::operator_cast_to_FileDescriptorSet(&local_50,&local_70);
  RoundTripDescriptor(&local_50);
  google::protobuf::FileDescriptorSet::~FileDescriptorSet(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

TEST(FuzzTest, NegativeOneofIndex) {
  RoundTripDescriptor(ParseTextProtoOrDie(
      R"pb(file {
             message_type {
               name: "A"
               field { name: "A" number: 0 type_name: "" oneof_index: -1 }
             }
           }
      )pb"));
}